

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O0

bool match(string *r,string *t,int flags)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  runtime_error *this;
  int in_EDX;
  string *in_RDI;
  ostringstream oss;
  bool v2;
  bool v1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> m;
  regex re;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_fffffffffffffdc0;
  string local_1e8 [32];
  ostringstream local_1c8 [379];
  byte local_4d;
  byte local_39;
  undefined1 local_38 [24];
  regex local_20 [32];
  
  booster::regex::regex(local_20,in_RDI,in_EDX);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x10989f);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = std::__cxx11::string::c_str();
  iVar3 = std::__cxx11::string::size();
  local_39 = booster::regex::match((char *)local_20,pcVar4,iVar2 + iVar3);
  local_39 = local_39 & 1;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  lVar5 = std::__cxx11::string::c_str();
  lVar6 = std::__cxx11::string::size();
  local_4d = booster::regex::match((char *)local_20,pcVar4,(vector *)(lVar5 + lVar6),(int)local_38);
  bVar1 = local_39;
  local_4d = local_4d & 1;
  if ((local_39 & 1) == local_4d) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              (in_stack_fffffffffffffdc0);
    booster::regex::~regex(local_20);
    return (bool)(bVar1 & 1);
  }
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  poVar7 = std::operator<<((ostream *)local_1c8,"Error ");
  poVar7 = std::operator<<(poVar7,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar7 = std::operator<<(poVar7,":");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x27);
  std::operator<<(poVar7," v1==v2");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_1e8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool match(std::string r,std::string t,int flags = 0)
{
	booster::regex re(r,flags);
	std::vector<std::pair<int,int> > m;
	bool v1 = re.match(t.c_str(),t.c_str()+t.size());
	bool v2 = re.match(t.c_str(),t.c_str()+t.size(),m);
	TEST(v1==v2);
	return v1;
}